

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall ApprovalTests::Options::Options(Options *this,Scrubber *scrubber)

{
  _Function_base _Stack_38;
  
  FileOptions::FileOptions(&this->fileOptions_);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->scrubber_,scrubber);
  defaultReporter();
  this->reporter_ = &defaultReporter::defaultReporter.super_Reporter;
  DefaultNamerFactory::getDefaultNamer();
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::operator()
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)&this->namer_);
  ::std::_Function_base::~_Function_base(&_Stack_38);
  this->usingDefaultScrubber_ = false;
  return;
}

Assistant:

Options::Options(Scrubber scrubber) : scrubber_(std::move(scrubber))
    {
        usingDefaultScrubber_ = false;
    }